

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O1

void stringify_token(Token *tok)

{
  TokenType TVar1;
  char *pcVar2;
  char *pcVar3;
  
  TVar1 = tok->type;
  if (TVar1 == TK_STRING_LITERAL) {
    escapeJSON((tok->u).s,&escapedStr_abi_cxx11_);
    pcVar2 = "\"";
    pcVar3 = (char *)escapedStr_abi_cxx11_._M_dataplus;
  }
  else {
    if (TVar1 == TK_FLOAT) {
      snprintf(tokstr,0x40,"%g",(tok->u).d);
    }
    else {
      if (TVar1 != TK_INTEGER) {
        pcVar3 = (char *)(tok->u).d;
        pcVar2 = "\"";
        goto LAB_0012b110;
      }
      snprintf(tokstr,0x40,"%llu",(tok->u).d);
    }
    pcVar3 = tokstr;
    pcVar2 = "";
  }
LAB_0012b110:
  snprintf(buf,0x3ffff,"\"tt\":\"%s\",\"val\":%s%s%s,\"line\":%d,\"col\":%d",
           token_type_names[(int)tok->type],pcVar2,pcVar3,pcVar2,(ulong)(uint)tok->line,
           (ulong)tok->column);
  return;
}

Assistant:

static void stringify_token(Token & tok)
{
  const char * ptr = tokstr;
  const char * quote = "";
  if (tok.type == TK_INTEGER)
    snprintf(tokstr, 64, "%llu", (long long unsigned int)tok.u.i);
  else if (tok.type == TK_FLOAT)
    snprintf(tokstr, 64, "%g", tok.u.d);
  else if (tok.type == TK_STRING_LITERAL)
  {
    escapeJSON(tok.u.s, escapedStr);
    ptr = escapedStr.c_str();
    quote = "\"";
  }
  else
  {
    ptr = tok.u.s;
    quote = "\"";
  }

  snprintf(buf, sizeof(buf) - 1, "\"tt\":\"%s\",\"val\":%s%s%s,\"line\":%d,\"col\":%d",
    token_type_names[int(tok.type)], quote, ptr, quote, tok.line, tok.column);
}